

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_Alt_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  flatcc_builder_ref_t *pfVar1;
  int iVar2;
  flatcc_builder_ref_t fVar3;
  flatcc_builder_ref_t *pfVar4;
  char *pcVar5;
  float local_6c;
  size_t sStack_68;
  float val;
  size_t h_unions;
  uint64_t w;
  char *mark;
  flatcc_builder_ref_t *pref;
  void *pvStack_40;
  flatcc_builder_ref_t ref;
  void *pval;
  flatcc_builder_ref_t *pfStack_30;
  int more;
  flatcc_builder_ref_t *result_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  pfStack_30 = result;
  result_local = (flatcc_builder_ref_t *)end;
  end_local = buf;
  buf_local = (char *)ctx;
  iVar2 = flatcc_builder_start_table(ctx->ctx,9);
  pfVar1 = result_local;
  if ((iVar2 == 0) &&
     (pfVar4 = (flatcc_builder_ref_t *)
               flatcc_json_parser_prepare_unions
                         ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,1,
                          &stack0xffffffffffffff98), pfVar1 != pfVar4)) {
    end_local = flatcc_json_parser_object_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                           (int *)((long)&pval + 4));
    while (pval._4_4_ != 0) {
      end_local = flatcc_json_parser_symbol_start
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
      if (h_unions < 0x6d756c74696b0000) {
        if (h_unions < 0x6d616e79616e7900) {
          if (h_unions == 0x66697865645f6172) {
            end_local = end_local + 8;
            h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
            if ((h_unions & 0xffffff0000000000) == 0x7261790000000000) {
              w = (uint64_t)end_local;
              end_local = flatcc_json_parser_match_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,3);
              if ((char *)w == end_local) {
                end_local = flatcc_json_parser_unmatched_symbol
                                      ((flatcc_json_parser_t *)buf_local,end_local,
                                       (char *)result_local);
              }
              else {
                pvStack_40 = flatcc_builder_table_add(*(flatcc_builder_t **)buf_local,8,0x7c,4);
                if (pvStack_40 == (void *)0x0) goto LAB_001144f0;
                end_local = MyGame_Example_FooBar_parse_json_struct_inline
                                      ((flatcc_json_parser_t *)buf_local,end_local,
                                       (char *)result_local,pvStack_40);
              }
            }
            else {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
          }
          else {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
        }
        else if (h_unions == 0x6d616e79616e795f) {
          end_local = end_local + 8;
          h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
          if ((h_unions & 0xffffffff00000000) == 0x7479706500000000) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   4);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = flatcc_json_parser_union_type_vector
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,0,3,sStack_68,
                                     MyGame_Example_Alt_parse_json_table::symbolic_parsers,
                                     MyGame_Example_Any_parse_json_union,
                                     MyGame_Example_Any_json_union_accept_type);
            }
          }
          else {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
        }
        else {
          if ((h_unions & 0xffffffffffffff00) == 0x6d616e79616e7900) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   7);
            if ((char *)w != end_local) {
              end_local = flatcc_json_parser_union_vector
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,0,3,sStack_68,
                                     MyGame_Example_Any_parse_json_union);
              goto LAB_0011448a;
            }
          }
          if ((h_unions & 0xffffffffff000000) == 0x6d6f766965000000) {
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_match_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   5);
            if ((char *)w == end_local) {
              end_local = flatcc_json_parser_unmatched_symbol
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local);
            }
            else {
              end_local = Fantasy_Movie_parse_json_table
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,(flatcc_builder_ref_t *)((long)&pref + 4))
              ;
              if ((pref._4_4_ == 0) ||
                 (mark = (char *)flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,1),
                 (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
              *(flatcc_builder_ref_t *)mark = pref._4_4_;
            }
          }
          else {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
        }
      }
      else if (h_unions < 0x7072656669780000) {
        if ((h_unions & 0xffffffffff000000) == 0x6e616d6573000000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,5)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            iVar2 = flatcc_builder_start_offset_vector(*(flatcc_builder_t **)buf_local);
            if (iVar2 != 0) goto LAB_001144f0;
            end_local = flatcc_json_parser_array_start
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   (int *)((long)&pval + 4));
            while (pval._4_4_ != 0) {
              end_local = flatcc_json_parser_build_string
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,(flatcc_builder_ref_t *)((long)&pref + 4))
              ;
              if ((pref._4_4_ == 0) ||
                 (mark = (char *)flatcc_builder_extend_offset_vector
                                           (*(flatcc_builder_t **)buf_local,1),
                 (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
              *(flatcc_builder_ref_t *)mark = pref._4_4_;
              end_local = flatcc_json_parser_array_end
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,(int *)((long)&pval + 4));
            }
            pref._4_4_ = flatcc_builder_end_offset_vector(*(flatcc_builder_t **)buf_local);
            if ((pref._4_4_ == 0) ||
               (mark = (char *)flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,6),
               (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
            *(flatcc_builder_ref_t *)mark = pref._4_4_;
          }
        }
        else if ((h_unions & 0xffffffffffff0000) == 0x6d756c74696b0000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,6)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            iVar2 = flatcc_builder_start_offset_vector(*(flatcc_builder_t **)buf_local);
            if (iVar2 != 0) goto LAB_001144f0;
            end_local = flatcc_json_parser_array_start
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   (int *)((long)&pval + 4));
            while (pval._4_4_ != 0) {
              end_local = MyGame_Example_MultipleKeys_parse_json_table
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,(flatcc_builder_ref_t *)((long)&pref + 4))
              ;
              if ((pref._4_4_ == 0) ||
                 (mark = (char *)flatcc_builder_extend_offset_vector
                                           (*(flatcc_builder_t **)buf_local,1),
                 (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
              *(flatcc_builder_ref_t *)mark = pref._4_4_;
              end_local = flatcc_json_parser_array_end
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,(int *)((long)&pval + 4));
            }
            pref._4_4_ = flatcc_builder_end_offset_vector(*(flatcc_builder_t **)buf_local);
            if ((pref._4_4_ == 0) ||
               (mark = (char *)flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,4),
               (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
            *(flatcc_builder_ref_t *)mark = pref._4_4_;
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if (h_unions < 0x726170756e7a656c) {
        if ((h_unions & 0xffffffffffff0000) == 0x7072656669780000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,6)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            end_local = MyGame_Example_TestJSONPrefix_parse_json_table
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   (flatcc_builder_ref_t *)((long)&pref + 4));
            if ((pref._4_4_ == 0) ||
               (mark = (char *)flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,0),
               (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
            *(flatcc_builder_ref_t *)mark = pref._4_4_;
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if (h_unions == 0x726170756e7a656c) {
        end_local = end_local + 8;
        h_unions = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
        if ((h_unions & 0xff00000000000000) == 0x7300000000000000) {
          w = (uint64_t)end_local;
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,1)
          ;
          if ((char *)w == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            iVar2 = flatcc_builder_start_vector(*(flatcc_builder_t **)buf_local,8,4,0x1fffffff);
            if (iVar2 != 0) goto LAB_001144f0;
            end_local = flatcc_json_parser_array_start
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   (int *)((long)&pval + 4));
            while (pval._4_4_ != 0) {
              pvStack_40 = flatcc_builder_extend_vector(*(flatcc_builder_t **)buf_local,1);
              if (pvStack_40 == (void *)0x0) goto LAB_001144f0;
              end_local = Fantasy_Rapunzel_parse_json_struct_inline
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,pvStack_40);
              end_local = flatcc_json_parser_array_end
                                    ((flatcc_json_parser_t *)buf_local,end_local,
                                     (char *)result_local,(int *)((long)&pval + 4));
            }
            pref._4_4_ = flatcc_builder_end_vector(*(flatcc_builder_t **)buf_local);
            if ((pref._4_4_ == 0) ||
               (mark = (char *)flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,5),
               (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
            *(flatcc_builder_ref_t *)mark = pref._4_4_;
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if ((h_unions & 0xffffffffffffff00) == 0x73616d706c657300) {
        w = (uint64_t)end_local;
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,7);
        if ((char *)w == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
        else {
          iVar2 = flatcc_builder_start_vector(*(flatcc_builder_t **)buf_local,4,4,0x3fffffff);
          if (iVar2 != 0) goto LAB_001144f0;
          end_local = flatcc_json_parser_array_start
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                 (int *)((long)&pval + 4));
          while (pval._4_4_ != 0) {
            local_6c = 0.0;
            pvStack_40 = flatcc_builder_extend_vector(*(flatcc_builder_t **)buf_local,1);
            if (pvStack_40 == (void *)0x0) goto LAB_001144f0;
            w = (uint64_t)end_local;
            end_local = flatcc_json_parser_float
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   &local_6c);
            if (((char *)w == end_local) &&
               ((w = (uint64_t)end_local,
                end_local = flatcc_json_parser_symbolic_float
                                      ((flatcc_json_parser_t *)buf_local,end_local,
                                       (char *)result_local,
                                       MyGame_Example_Alt_parse_json_table::symbolic_parsers_1,
                                       &local_6c), end_local == (char *)w ||
                ((flatcc_builder_ref_t *)end_local == result_local)))) goto LAB_001144f0;
            flatbuffers_float_write_to_pe(pvStack_40,local_6c);
            end_local = flatcc_json_parser_array_end
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   (int *)((long)&pval + 4));
          }
          pref._4_4_ = flatcc_builder_end_vector(*(flatcc_builder_t **)buf_local);
          if ((pref._4_4_ == 0) ||
             (mark = (char *)flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,7),
             (flatcc_builder_ref_t *)mark == (flatcc_builder_ref_t *)0x0)) goto LAB_001144f0;
          *(flatcc_builder_ref_t *)mark = pref._4_4_;
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      }
LAB_0011448a:
      end_local = flatcc_json_parser_object_end
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                             (int *)((long)&pval + 4));
    }
    if (*(int *)(buf_local + 0x20) == 0) {
      end_local = flatcc_json_parser_finalize_unions
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                             sStack_68);
      fVar3 = flatcc_builder_end_table(*(flatcc_builder_t **)buf_local);
      *pfStack_30 = fVar3;
      if (fVar3 != 0) {
        return end_local;
      }
    }
  }
LAB_001144f0:
  pcVar5 = flatcc_json_parser_set_error
                     ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,0x23);
  return pcVar5;
}

Assistant:

static const char *MyGame_Example_Alt_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;
    size_t h_unions;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 9)) goto failed;
    if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, 1, &h_unions)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6d756c74696b0000) { /* branch "multik" */
            if (w < 0x6d616e79616e7900) { /* branch "manyany" */
                if (w == 0x66697865645f6172) { /* descend "fixed_ar" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffff0000000000) == 0x7261790000000000) { /* "ray" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 3);
                        if (mark != buf) {
                            if (!(pval = flatcc_builder_table_add(ctx->ctx, 8, 124, 4))) goto failed;
                            buf = MyGame_Example_FooBar_parse_json_struct_inline(ctx, buf, end, pval);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "ray" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "ray" */
                } else { /* descend "fixed_ar" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* descend "fixed_ar" */
            } else { /* branch "manyany" */
                if (w == 0x6d616e79616e795f) { /* descend "manyany_" */
                    buf += 8;
                    w = flatcc_json_parser_symbol_part(buf, end);
                    if ((w & 0xffffffff00000000) == 0x7479706500000000) { /* "type" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                        if (mark != buf) {
                            static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                    MyGame_Example_Any_parse_json_enum,
                                    monster_test_local_MyGame_Example_json_parser_enum,
                                    monster_test_global_json_parser_enum, 0 };
                            buf = flatcc_json_parser_union_type_vector(ctx, buf, end, 0, 3, h_unions, symbolic_parsers, MyGame_Example_Any_parse_json_union, MyGame_Example_Any_json_union_accept_type);
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "type" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "type" */
                } else { /* descend "manyany_" */
                    if ((w & 0xffffffffffffff00) == 0x6d616e79616e7900) { /* "manyany" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                        if (mark != buf) {
                            buf = flatcc_json_parser_union_vector(ctx, buf, end, 0, 3, h_unions, MyGame_Example_Any_parse_json_union);
                        } else {
                            goto pfguard1;
                        }
                    } else { /* "manyany" */
                        goto pfguard1;
                    } /* "manyany" */
                    goto endpfguard1;
pfguard1:
                    if ((w & 0xffffffffff000000) == 0x6d6f766965000000) { /* "movie" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                        if (mark != buf) {
                            buf = Fantasy_Movie_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "movie" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "movie" */
endpfguard1:
                    (void)0;
                } /* descend "manyany_" */
            } /* branch "manyany" */
        } else { /* branch "multik" */
            if (w < 0x7072656669780000) { /* branch "prefix" */
                if ((w & 0xffffffffff000000) == 0x6e616d6573000000) { /* "names" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 5);
                    if (mark != buf) {
                        if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                        buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                        while (more) {
                            buf = flatcc_json_parser_build_string(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                            *pref = ref;
                            buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                        }
                        ref = flatcc_builder_end_offset_vector(ctx->ctx);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 6))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "names" */
                    if ((w & 0xffffffffffff0000) == 0x6d756c74696b0000) { /* "multik" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            if (flatcc_builder_start_offset_vector(ctx->ctx)) goto failed;
                            buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                            while (more) {
                                buf = MyGame_Example_MultipleKeys_parse_json_table(ctx, buf, end, &ref);
                                if (!ref || !(pref = flatcc_builder_extend_offset_vector(ctx->ctx, 1))) goto failed;
                                *pref = ref;
                                buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                            }
                            ref = flatcc_builder_end_offset_vector(ctx->ctx);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 4))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "multik" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "multik" */
                } /* "names" */
            } else { /* branch "prefix" */
                if (w < 0x726170756e7a656c) { /* branch "rapunzel" */
                    if ((w & 0xffffffffffff0000) == 0x7072656669780000) { /* "prefix" */
                        buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                        if (mark != buf) {
                            buf = MyGame_Example_TestJSONPrefix_parse_json_table(ctx, buf, end, &ref);
                            if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                            *pref = ref;
                        } else {
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        }
                    } else { /* "prefix" */
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    } /* "prefix" */
                } else { /* branch "rapunzel" */
                    if (w == 0x726170756e7a656c) { /* descend "rapunzel" */
                        buf += 8;
                        w = flatcc_json_parser_symbol_part(buf, end);
                        if ((w & 0xff00000000000000) == 0x7300000000000000) { /* "s" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 1);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 8, 4, UINT64_C(536870911))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = Fantasy_Rapunzel_parse_json_struct_inline(ctx, buf, end, pval);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 5))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "s" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "s" */
                    } else { /* descend "rapunzel" */
                        if ((w & 0xffffffffffffff00) == 0x73616d706c657300) { /* "samples" */
                            buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                            if (mark != buf) {
                                if (flatcc_builder_start_vector(ctx->ctx, 4, 4, UINT64_C(1073741823))) goto failed;
                                buf = flatcc_json_parser_array_start(ctx, buf, end, &more);
                                while (more) {
                                    float val = 0;
                                    static flatcc_json_parser_integral_symbol_f *symbolic_parsers[] = {
                                            monster_test_local_MyGame_Example_json_parser_enum,
                                            monster_test_global_json_parser_enum, 0 };
                                    if (!(pval = flatcc_builder_extend_vector(ctx->ctx, 1))) goto failed;
                                    buf = flatcc_json_parser_float(ctx, (mark = buf), end, &val);
                                    if (mark == buf) {
                                        buf = flatcc_json_parser_symbolic_float(ctx, (mark = buf), end, symbolic_parsers, &val);
                                        if (buf == mark || buf == end) goto failed;
                                    }
                                    flatbuffers_float_write_to_pe(pval, val);
                                    buf = flatcc_json_parser_array_end(ctx, buf, end, &more);
                                }
                                ref = flatcc_builder_end_vector(ctx->ctx);
                                if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 7))) goto failed;
                                *pref = ref;
                            } else {
                                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                            }
                        } else { /* "samples" */
                            buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                        } /* "samples" */
                    } /* descend "rapunzel" */
                } /* branch "rapunzel" */
            } /* branch "prefix" */
        } /* branch "multik" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}